

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O2

void clause_unwatch(solver_t *s,uint cref)

{
  uint *puVar1;
  watch_list *pwVar2;
  
  puVar1 = s->all_clauses->data;
  pwVar2 = vec_wl_at(s->watches,puVar1[(ulong)cref + 2] ^ 1);
  watch_list_remove(pwVar2,cref,(uint)(puVar1[(ulong)cref + 1] == 2));
  pwVar2 = vec_wl_at(s->watches,puVar1[(ulong)cref + 3] ^ 1);
  watch_list_remove(pwVar2,cref,(uint)(puVar1[(ulong)cref + 1] == 2));
  return;
}

Assistant:

static inline void clause_unwatch(solver_t *s, unsigned cref)
{
    struct clause *clause = cdb_handler(s->all_clauses, cref);
    watch_list_remove(vec_wl_at(s->watches, lit_compl(clause->data[0].lit)), cref, (clause->size == 2));
    watch_list_remove(vec_wl_at(s->watches, lit_compl(clause->data[1].lit)), cref, (clause->size == 2));
}